

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

Name __thiscall
wasm::anon_unknown_18::getGlobalElem(anon_unknown_18 *this,Module *module,Name global,Index i)

{
  IString IVar1;
  Name NVar2;
  string local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string_view local_48;
  uint local_34;
  anon_unknown_18 *paStack_30;
  Index i_local;
  Module *module_local;
  Name global_local;
  
  global_local.super_IString.str._M_len = global.super_IString.str._M_len;
  local_34 = (uint)global.super_IString.str._M_str;
  paStack_30 = this;
  module_local = module;
  IString::toString_abi_cxx11_(&local_a8,(IString *)&module_local);
  std::operator+(&local_88,&local_a8,'$');
  std::__cxx11::to_string(&local_d8,local_34);
  std::operator+(&local_68,&local_88,&local_d8);
  wasm::Name::Name((Name *)&local_48,&local_68);
  NVar2 = Names::getValidGlobalName((Module *)this,(Name)local_48);
  global_local.super_IString.str._M_str = NVar2.super_IString.str._M_len;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  IVar1.str._M_str = NVar2.super_IString.str._M_str;
  IVar1.str._M_len = (size_t)global_local.super_IString.str._M_str;
  return (IString)(IString)IVar1.str;
}

Assistant:

Name getGlobalElem(Module* module, Name global, Index i) {
  return Names::getValidGlobalName(*module,
                                   global.toString() + '$' + std::to_string(i));
}